

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

Code * __thiscall md::Code::bset(Code *this,DataRegister *dx,Param *target)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  iVar2 = (**(dx->super_Register).super_Param._vptr_Param)(dx);
  iVar3 = (*target->_vptr_Param[1])(target);
  iVar4 = (**target->_vptr_Param)(target);
  iVar2 = iVar4 + iVar2 * 0x200 + iVar3 * 8 + 0x1c0;
  local_40 = (uchar)((uint)iVar2 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar2;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*target->_vptr_Param[2])(&local_40,target);
  puVar5 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar5 != local_38) {
    do {
      local_41 = *puVar5;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_38);
  }
  pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_30 - (long)pvVar1);
  }
  return this;
}

Assistant:

Code& Code::bset(const DataRegister& dx, const Param& target)
{
    uint16_t opcode = 0x01C0 + (dx.getXn() << 9) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}